

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::protos::gen::TraceConfig_ProducerConfig::~TraceConfig_ProducerConfig
          (TraceConfig_ProducerConfig *this)

{
  TraceConfig_ProducerConfig *this_local;
  
  ~TraceConfig_ProducerConfig(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TraceConfig_ProducerConfig::~TraceConfig_ProducerConfig() = default;